

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

void __thiscall cursespp::App::~App(App *this)

{
  endwin();
  std::__cxx11::string::~string((string *)&this->appTitle);
  std::__cxx11::string::~string((string *)&this->quitKey);
  std::__cxx11::string::~string((string *)&this->colorTheme);
  std::_Function_base::~_Function_base(&(this->resizeHandler).super__Function_base);
  std::_Function_base::~_Function_base(&(this->keyHook).super__Function_base);
  std::_Function_base::~_Function_base(&(this->keyHandler).super__Function_base);
  WindowState::~WindowState(&this->state);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  return;
}

Assistant:

App::~App() {
    endwin();
}